

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QTextLayout::FormatRange>::clear(QList<QTextLayout::FormatRange> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QTextLayout::FormatRange> *this_00;
  __off_t __length;
  QArrayDataPointer<QTextLayout::FormatRange> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QTextLayout::FormatRange> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QTextLayout::FormatRange> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QTextLayout::FormatRange> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QTextLayout::FormatRange>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QTextLayout::FormatRange>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QTextLayout::FormatRange> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QTextLayout::FormatRange>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QTextLayout::FormatRange>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QTextLayout::FormatRange>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QTextLayout::FormatRange> *)
                QArrayDataPointer<QTextLayout::FormatRange>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QTextLayout::FormatRange>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }